

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O1

bool __thiscall
FMB::FiniteModelMultiSorted::evaluate(FiniteModelMultiSorted *this,Formula *formula,uint depth)

{
  Connective CVar1;
  uint var;
  uint uVar2;
  uint *puVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  undefined7 uVar12;
  Formula *pFVar8;
  Term *pTVar9;
  undefined8 *puVar10;
  long *plVar11;
  uint *puVar13;
  long *plVar14;
  byte bVar15;
  uint uVar16;
  uint c;
  void **head;
  byte bVar17;
  undefined1 auVar18 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  uint uVar19;
  uint uVar20;
  undefined4 in_stack_fffffffffffffec4;
  byte local_138;
  undefined1 local_128 [32];
  undefined4 uStack_108;
  undefined4 local_104;
  Formula *local_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  string local_d8;
  TermList local_b8;
  long local_b0;
  long local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  uVar16 = depth + 1;
  bVar15 = 0;
  for (; CVar1 = formula->_connective, CVar1 == NOT; formula = *(Formula **)(formula + 1)) {
    bVar15 = bVar15 ^ 1;
    uVar16 = uVar16 + 1;
  }
  if (TRUE < CVar1) {
switchD_002ac155_caseD_6:
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x50);
    Kernel::Formula::toString_abi_cxx11_(&local_d8,formula);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   "Cannot evaluate ",&local_d8);
    plVar11 = (long *)std::__cxx11::string::append(local_128);
    local_f8 = (long *)*plVar11;
    plVar14 = plVar11 + 2;
    if (local_f8 == plVar14) {
      local_e8 = *plVar14;
      uStack_e0 = (undefined4)plVar11[3];
      uStack_dc = *(undefined4 *)((long)plVar11 + 0x1c);
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar14;
    }
    local_f0 = plVar11[1];
    *plVar11 = (long)plVar14;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    *puVar10 = &PTR_cry_00b69f40;
    puVar10[1] = puVar10 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar10 + 1),local_f8,local_f0 + (long)local_f8);
    *puVar10 = &PTR_cry_00b6a028;
    *(undefined4 *)(puVar10 + 5) = 0;
    puVar10[6] = puVar10 + 8;
    puVar10[7] = 0;
    *(undefined1 *)(puVar10 + 8) = 0;
    __cxa_throw(puVar10,&::Lib::UserErrorException::typeinfo,
                ::Lib::UserErrorException::~UserErrorException);
  }
  puVar13 = &switchD_002ac155::switchdataD_008f38f4;
  uVar12 = (undefined7)
           ((ulong)((long)&switchD_002ac155::switchdataD_008f38f4 +
                   (long)(int)(&switchD_002ac155::switchdataD_008f38f4)[CVar1]) >> 8);
  switch(CVar1) {
  case LITERAL:
    pTVar9 = *(Term **)(formula + 1);
    uVar16 = Kernel::Term::numVarOccs(pTVar9);
    if (uVar16 != 0) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x50);
      Kernel::Formula::toString_abi_cxx11_((string *)local_128,formula);
      std::operator+(&local_90,"Was not expecting free variables in ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128)
      ;
      *puVar10 = &PTR_cry_00b69f40;
      puVar10[1] = puVar10 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar10 + 1),local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      *puVar10 = &PTR_cry_00b6a028;
      *(undefined4 *)(puVar10 + 5) = 0;
      puVar10[6] = puVar10 + 8;
      puVar10[7] = 0;
      *(undefined1 *)(puVar10 + 8) = 0;
      __cxa_throw(puVar10,&::Lib::UserErrorException::typeinfo,
                  ::Lib::UserErrorException::~UserErrorException);
    }
    bVar5 = evaluateGroundLiteral(this,(Literal *)pTVar9);
    uVar19 = (uint)bVar5;
    break;
  case AND:
    uVar20 = 1;
    goto LAB_002ac1b1;
  case OR:
    uVar20 = 0;
LAB_002ac1b1:
    puVar10 = *(undefined8 **)(formula + 1);
    uVar19 = (uint)((long)&switchD_002ac155::switchdataD_008f38f4 +
                   (long)(int)(&switchD_002ac155::switchdataD_008f38f4)[CVar1]);
    do {
      bVar6 = (byte)uVar19;
      uVar19 = uVar20;
      if (puVar10 == (undefined8 *)0x0) break;
      pFVar8 = (Formula *)*puVar10;
      puVar10 = (undefined8 *)puVar10[1];
      bVar5 = evaluate(this,pFVar8,uVar16);
      if ((byte)(bVar5 | (byte)uVar20 ^ 1) == 1) {
        bVar17 = !bVar5 | (byte)uVar20;
        uVar19 = (uint)(byte)(bVar17 ^ 1 | bVar6);
      }
      else {
        bVar17 = 0;
        uVar19 = 0;
      }
    } while (bVar17 != 0);
    break;
  case IMP:
    bVar6 = 1;
    bVar17 = 1;
    goto LAB_002ac29e;
  case IFF:
    bVar6 = 1;
    goto LAB_002ac29b;
  case XOR:
    bVar6 = 0;
LAB_002ac29b:
    bVar17 = 0;
LAB_002ac29e:
    pFVar8 = (Formula *)formula[1]._label._M_dataplus._M_p;
    bVar5 = evaluate(this,*(Formula **)(formula + 1),uVar16);
    uVar19 = 1;
    if ((byte)(bVar17 ^ 1 | bVar5) == 1) {
      bVar4 = evaluate(this,pFVar8,uVar16);
      if (bVar17 == 0) {
        uVar19 = (uint)(byte)(bVar4 ^ bVar6 ^ bVar5);
      }
      else {
        uVar19 = (uint)(bVar4 || !bVar5);
      }
    }
    break;
  default:
    goto switchD_002ac155_caseD_6;
  case FORALL:
    uVar20 = (uint)CONCAT71(uVar12,1);
    goto LAB_002ac21c;
  case EXISTS:
    uVar20 = 0;
LAB_002ac21c:
    puVar3 = *(uint **)(formula + 1);
    var = *puVar3;
    if (*(long *)(puVar3 + 2) == 0) {
      pFVar8 = (Formula *)formula[1]._label._M_string_length;
    }
    else {
      pFVar8 = (Formula *)
               ::Lib::FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78))
      ;
      uVar19 = puVar3[2];
      uVar2 = puVar3[3];
      puVar3 = (uint *)formula[1]._label._M_string_length;
      pFVar8->_connective = formula->_connective;
      (pFVar8->_label)._M_dataplus._M_p = (pointer)&(pFVar8->_label).field_2;
      puVar13 = puVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pFVar8->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b7c330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      pFVar8[1]._connective = uVar19;
      *(uint *)&pFVar8[1].field_0x4 = uVar2;
      pFVar8[1]._label._M_dataplus._M_p = (pointer)0x0;
      pFVar8[1]._label._M_string_length = (size_type)puVar3;
    }
    local_b8._content = 2;
    bVar5 = Kernel::SortHelper::tryGetVariableSort(var,formula,&local_b8);
    if (!bVar5) {
      auVar18 = __cxa_allocate_exception(0x50);
      puVar10 = auVar18._0_8_;
      ::Lib::Int::toString_abi_cxx11_(&local_50,(Int *)(ulong)var,auVar18._8_4_);
      std::operator+(&local_d8,"Failed to get sort of ",&local_50);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_128._0_8_ = *plVar11;
      plVar14 = plVar11 + 2;
      if ((long *)local_128._0_8_ == plVar14) {
        local_128._16_4_ = (undefined4)*plVar14;
        local_128._20_4_ = (undefined4)((ulong)*plVar14 >> 0x20);
        local_128._24_4_ = (undefined4)plVar11[3];
        local_128._28_4_ = (undefined4)((ulong)plVar11[3] >> 0x20);
        local_128._0_8_ = local_128 + 0x10;
      }
      else {
        local_128._16_4_ = (undefined4)*plVar14;
        local_128._20_4_ = (undefined4)((ulong)*plVar14 >> 0x20);
      }
      local_128._8_4_ = (undefined4)plVar11[1];
      local_128._12_4_ = (undefined4)((ulong)plVar11[1] >> 0x20);
      *plVar11 = (long)plVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      Kernel::Formula::toString_abi_cxx11_(&local_70,formula);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffec4,uVar20),in_stack_fffffffffffffeb8);
      *puVar10 = &PTR_cry_00b69f40;
      puVar10[1] = puVar10 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar10 + 1),local_b0,local_a8 + local_b0);
      *puVar10 = &PTR_cry_00b6a028;
      *(undefined4 *)(puVar10 + 5) = 0;
      puVar10[6] = puVar10 + 8;
      puVar10[7] = 0;
      *(undefined1 *)(puVar10 + 8) = 0;
      __cxa_throw(puVar10,&::Lib::UserErrorException::typeinfo,
                  ::Lib::UserErrorException::~UserErrorException);
    }
    uVar2 = *(uint *)(local_b8._content + 8);
    uVar19 = uVar20;
    if ((this->_sizes)._array[uVar2] != 0) {
      bVar6 = (byte)uVar20 ^ 1;
      c = 1;
      uVar7 = uVar20 ^ 1;
      local_100 = pFVar8;
      do {
        local_128._0_4_ = 1;
        local_128._20_4_ = 0;
        local_128._24_4_ = 0;
        local_128._28_4_ = 0;
        uStack_108 = 0;
        local_128._4_4_ = 0;
        local_128._8_4_ = 0;
        local_128._12_4_ = 0;
        local_128._16_4_ = 0;
        local_104 = 0;
        pTVar9 = getDomainConstant(this,c,uVar2);
        Kernel::Substitution::bind
                  ((Substitution *)local_128,var,(sockaddr *)pTVar9,(socklen_t)puVar13);
        pFVar8 = Kernel::SubstHelper::applyImpl<false,Kernel::Substitution>
                           (local_100,(Substitution *)local_128,false);
        pFVar8 = Shell::SimplifyFalseTrue::simplify(pFVar8);
        pFVar8 = Shell::Flattening::flatten(pFVar8);
        bVar5 = evaluate(this,pFVar8,uVar16);
        if (bVar5 || bVar6 != 0) {
          bVar17 = !bVar5 | (byte)uVar20;
          local_138 = (byte)uVar7;
          uVar7 = (uint)(byte)(bVar17 ^ 1 | local_138);
        }
        else {
          bVar17 = 0;
          uVar7 = 0;
        }
        ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   local_128);
        uVar19 = uVar7;
      } while ((bVar17 != 0) && (c = c + 1, uVar19 = uVar20, c <= (this->_sizes)._array[uVar2]));
    }
    break;
  case FALSE:
    uVar19 = 0;
    break;
  case TRUE:
    uVar19 = (uint)CONCAT71(uVar12,1);
  }
  return (bool)((bVar15 ^ (byte)uVar19) & 1);
}

Assistant:

bool FiniteModelMultiSorted::evaluate(Formula* formula,unsigned depth)
{
#if DEBUG_MODEL
  for(unsigned i=0;i<depth;i++){ cout << "."; }
  cout << "Evaluating..." << formula->toString() << endl;
#endif

  bool isAnd = false;
  bool isImp = false;
  bool isXor = false;
  bool isForall = false;
  switch(formula->connective()){
    // If it's a literal evaluate that
    case LITERAL:
    {
      Literal* lit = formula->literal();
      if(!lit->ground()){
        USER_ERROR("Was not expecting free variables in "+formula->toString());
      }
      return evaluateGroundLiteral(lit);
    }

    // Expand the standard ones
    case FALSE:
      return false;
    case TRUE:
      return true;
    case NOT:
      return !evaluate(formula->uarg(),depth+1);
    case AND:
      isAnd=true;
    case OR:
      {
        FormulaList* args = formula->args();
        FormulaList::Iterator fit(args);
        while(fit.hasNext()){
          Formula* arg = fit.next();
          bool res = evaluate(arg,depth+1);
          if(isAnd && !res) return false;
          if(!isAnd && res) return true;
        }
        return isAnd;
      }

    case IMP:
     isImp=true;
    case XOR:
     isXor = !isImp;
    case IFF:
    {
      Formula* left = formula->left();
      Formula* right = formula->right();
      bool left_res = evaluate(left,depth+1);
      if(isImp && !left_res) return true;
      bool right_res = evaluate(right,depth+1);

#if DEBUG_MODEL
      cout << "left_res is " << left_res << ", right_res is " << right_res << endl;
#endif

      if(isImp) return !left_res || right_res;
      if(isXor) return left_res != right_res;
      return left_res == right_res; // IFF
    }

    // Expand quantifications
    case FORALL:
     isForall = true;
    case EXISTS:
    {
     VList* vs = formula->vars();
     int var = vs->head();

     //cout << "Quant " << isForall << " with " << var << endl;

     Formula* next = 0;
     if(vs->tail()) next = new QuantifiedFormula(formula->connective(),vs->tail(),0,formula->qarg());
     else next = formula->qarg();

     TermList srt;
     if(!SortHelper::tryGetVariableSort(var,formula,srt)){
       USER_ERROR("Failed to get sort of "+Lib::Int::toString(var)+" in "+formula->toString());
     }

     unsigned srtU = srt.term()->functor();
     for(unsigned c=1;c<=_sizes[srtU];c++){
       Substitution s;
       s.bind(var,getDomainConstant(c,srtU));
       Formula* next_sub = SubstHelper::apply(next,s);
       next_sub = SimplifyFalseTrue::simplify(next_sub);
       next_sub = Flattening::flatten(next_sub);

       bool res = evaluate(next_sub,depth+1);

       //TODO try and limit memory issues!
       //     ideally delete the bits introduced by the application of SubstHelper::apply
       //if(next_sub!=next) next_sub->destroy();

       if(isForall && !res) return false;
       if(!isForall && res) return true;
     }

     return isForall;
    }
    default:
      USER_ERROR("Cannot evaluate " + formula->toString() + ", not supported");
  }

  NOT_IMPLEMENTED;
  return false;
}